

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O0

socket_t net_listen(char *ip,int port)

{
  int iVar1;
  socket_t fd;
  int len;
  sockaddr_in addr;
  int port_local;
  char *ip_local;
  
  addr.sin_zero._0_4_ = port;
  unique0x100000e3 = ip;
  memset(&fd,0,0x10);
  fd._0_2_ = 2;
  len = inet_addr(stack0xffffffffffffffe8);
  fd._2_2_ = htons(addr.sin_zero._0_2_);
  ip_local._4_4_ = socket(2,1,0);
  if (ip_local._4_4_ < 0) {
    ip_local._4_4_ = -1;
  }
  else {
    set_no_block(ip_local._4_4_);
    set_reuse_addr(ip_local._4_4_);
    iVar1 = bind(ip_local._4_4_,(sockaddr *)&fd,0x10);
    if (iVar1 < 0) {
      close_socket(ip_local._4_4_);
      ip_local._4_4_ = -1;
    }
    else {
      iVar1 = listen(ip_local._4_4_,5);
      if (iVar1 < 0) {
        close_socket(ip_local._4_4_);
        ip_local._4_4_ = -1;
      }
    }
  }
  return ip_local._4_4_;
}

Assistant:

socket_t net_listen(const char* ip, int port)
{
    sockaddr_in addr;
    int len = sizeof (struct sockaddr_in);
    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = inet_addr(ip);
    addr.sin_port = htons(port);
    
    socket_t fd = ::socket(AF_INET, SOCK_STREAM, 0);
    if (fd < 0) 
    {
        return -1;
    }

    set_no_block(fd);
    set_reuse_addr(fd);

    if (::bind(fd, (struct sockaddr*)&addr, len) < 0) 
    {
        close_socket(fd);
        return -1;
    }

    if (::listen(fd, 5) < 0) 
    {
        close_socket(fd);
        return -1;
    }

    return fd;
}